

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::initRhoAvg(NavierStokesBase *this,Real alpha)

{
  bool bVar1;
  FabArray<amrex::FArrayBox> *in_RDI;
  Array4<const_double> *rho_new;
  Array4<double> *rhoavg;
  Box *bx;
  MFIter mfi;
  MultiFab *S_new;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  AmrLevel *in_stack_fffffffffffffe30;
  FabArray<amrex::FArrayBox> *this_00;
  undefined1 local_1b8 [15];
  undefined1 in_stack_fffffffffffffe57;
  FabArrayBase *in_stack_fffffffffffffe58;
  MFIter *in_stack_fffffffffffffe60;
  anon_class_136_3_0f84d857 *in_stack_fffffffffffffe70;
  Box *in_stack_fffffffffffffe78;
  undefined1 auStack_178 [8];
  MFIter *in_stack_fffffffffffffe90;
  undefined1 local_130 [64];
  undefined1 *local_f0;
  undefined1 local_e8 [64];
  undefined1 *local_a8;
  undefined1 local_9c [132];
  MultiFab *local_18;
  
  local_18 = amrex::AmrLevel::get_new_data(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffe30,
             (value_type)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this_00 = (FabArray<amrex::FArrayBox> *)
            ((long)&in_RDI[8].super_FabArrayBase.boxarray.m_bat.m_op + 0x14);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57);
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)(local_9c + 0x24));
    if (!bVar1) break;
    amrex::MFIter::tilebox(in_stack_fffffffffffffe90);
    local_9c._28_8_ = local_9c;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_RDI,(MFIter *)in_stack_fffffffffffffe30);
    local_a8 = local_e8;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_RDI,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    local_f0 = local_130;
    in_stack_fffffffffffffe30 = (AmrLevel *)local_9c._28_8_;
    memcpy(local_1b8,local_a8,0x3c);
    memcpy(auStack_178,local_f0,0x3c);
    amrex::ParallelFor<NavierStokesBase::initRhoAvg(double)::__0>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    amrex::MFIter::operator++((MFIter *)(local_9c + 0x24));
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffe30);
  return;
}

Assistant:

void
NavierStokesBase::initRhoAvg (Real alpha)
{
    const MultiFab& S_new = get_new_data(State_Type);

    // Set to a ridiculous number just for debugging -- shouldn't need this otherwise
    rho_avg.setVal(1.e200);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rho_avg,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& rhoavg     = rho_avg.array(mfi);
       auto const& rho_new    = S_new.array(mfi,Density);
       amrex::ParallelFor(bx, [rhoavg,rho_new,alpha]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
          rhoavg(i,j,k) = rho_new(i,j,k) * alpha;
       });
    }
}